

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_node(mg_session *session,mg_node **node)

{
  int iVar1;
  int iVar2;
  mg_node *buf;
  long lVar3;
  ulong uVar4;
  uint32_t label_count;
  int64_t id;
  uint local_44;
  mg_node **local_40;
  int64_t local_38;
  
  iVar1 = mg_session_check_struct_header(session,0xb3,'N');
  if (((iVar1 == 0) && (iVar1 = mg_session_read_integer(session,&local_38), iVar1 == 0)) &&
     (iVar1 = mg_session_read_container_size(session,&local_44,MG_MARKERS_LIST), iVar1 == 0)) {
    buf = mg_node_alloc(local_44,session->decoder_allocator);
    if (buf == (mg_node *)0x0) {
      mg_session_set_error(session,"out of memory");
      iVar1 = -3;
    }
    else {
      buf->id = local_38;
      buf->label_count = 0;
      iVar2 = 8;
      local_40 = node;
      if ((ulong)local_44 == 0) {
        iVar1 = 0;
      }
      else {
        lVar3 = 0;
        do {
          iVar1 = mg_session_read_string(session,(mg_string **)((long)buf->labels + lVar3));
          if (iVar1 != 0) {
            iVar2 = 0xb;
            goto LAB_00106d40;
          }
          buf->label_count = buf->label_count + 1;
          lVar3 = lVar3 + 8;
        } while ((ulong)local_44 << 3 != lVar3);
        iVar1 = 0;
        iVar2 = 8;
      }
LAB_00106d40:
      if (iVar2 != 0xb) {
        if (iVar2 != 8) {
          return 0;
        }
        iVar1 = mg_session_read_map(session,&buf->properties);
        if (iVar1 == 0) {
          *local_40 = buf;
          return 0;
        }
      }
      if (buf->label_count != 0) {
        uVar4 = 0;
        do {
          mg_string_destroy_ca(buf->labels[uVar4],session->decoder_allocator);
          uVar4 = uVar4 + 1;
        } while (uVar4 < buf->label_count);
      }
      mg_allocator_free(session->decoder_allocator,buf);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_node(mg_session *session, mg_node **node) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 3), MG_SIGNATURE_NODE));

  int64_t id;
  MG_RETURN_IF_FAILED(mg_session_read_integer(session, &id));

  uint32_t label_count;
  MG_RETURN_IF_FAILED(
      mg_session_read_container_size(session, &label_count, MG_MARKERS_LIST));

  mg_node *tnode = mg_node_alloc(label_count, session->decoder_allocator);
  if (!tnode) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  tnode->id = id;
  tnode->label_count = 0;
  for (uint32_t i = 0; i < label_count; ++i) {
    status = mg_session_read_string(session, &tnode->labels[i]);
    if (status != 0) {
      goto cleanup;
    }
    tnode->label_count++;
  }

  status = mg_session_read_map(session, &tnode->properties);
  if (status != 0) {
    goto cleanup;
  }

  *node = tnode;

  return 0;

cleanup:
  for (uint32_t i = 0; i < tnode->label_count; ++i) {
    mg_string_destroy_ca(tnode->labels[i], session->decoder_allocator);
  }
  mg_allocator_free(session->decoder_allocator, tnode);
  return status;
}